

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void lexer_Init(void)

{
  long lVar1;
  char *pcVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  ushort uVar7;
  
  uVar3 = 1;
  lVar4 = 0;
  do {
    cVar6 = *keywords[lVar4].name;
    if (cVar6 == '\0') {
      uVar5 = 0;
    }
    else {
      uVar7 = 0;
      pcVar2 = keywords[lVar4].name;
      do {
        lVar1 = (ulong)uVar7 * 0x80 + (ulong)uVar7 * 8;
        if (*(short *)(lVar1 + 0x1a89a0 + (long)cVar6 * 2) == 0) {
          if (0x178 < uVar3) {
            __assert_fail("usedNodes < sizeof(keywordDict) / sizeof(*keywordDict)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                          ,0x259,"lexer_Init");
          }
          *(ushort *)(lVar1 + 0x1a89a0 + (long)cVar6 * 2) = uVar3;
          uVar3 = uVar3 + 1;
        }
        uVar7 = *(ushort *)(lVar1 + 0x1a89a0 + (long)*pcVar2 * 2);
        cVar6 = pcVar2[1];
        pcVar2 = pcVar2 + 1;
      } while (cVar6 != '\0');
      uVar5 = (ulong)uVar7;
    }
    *(KeywordMapping **)
     ((long)keywordDict[0].children + (ulong)(uint)((int)uVar5 << 7) + uVar5 * 8 + 0x80) =
         keywords + lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xa0);
  return;
}

Assistant:

void lexer_Init(void)
{
	// Build the dictionary of keywords. This could be done at compile time instead, however:
	// - Doing so manually is a task nobody wants to undertake
	// - It would be massively hard to read
	// - Doing it within CC or CPP would be quite non-trivial
	// - Doing it externally would require some extra work to use only POSIX tools
	// - The startup overhead isn't much compared to the program's
	uint16_t usedNodes = 1;

	for (size_t i = 0; i < ARRAY_SIZE(keywords); i++) {
		uint16_t nodeID = 0;

		// Walk the dictionary, creating intermediate nodes for the keyword
		for (char const *ptr = keywords[i].name; *ptr; ptr++) {
			// We should be able to assume all entries are well-formed
			if (keywordDict[nodeID].children[*ptr - ' '] == 0) {
				// If this gets tripped up, set the size of keywordDict to
				// something high, compile with `-DPRINT_NODE_COUNT` (see below),
				// and set the size to that.
				assert(usedNodes < sizeof(keywordDict) / sizeof(*keywordDict));

				// There is no node at that location, grab one from the pool
				keywordDict[nodeID].children[*ptr - ' '] = usedNodes;
				usedNodes++;
			}
			nodeID = keywordDict[nodeID].children[*ptr - ' '];
		}

		// This assumes that no two keywords have the same name
		keywordDict[nodeID].keyword = &keywords[i];
	}

#ifdef PRINT_NODE_COUNT // For the maintainer to check how many nodes are needed
	printf("Lexer keyword dictionary: %zu keywords in %u nodes (pool size %zu)\n",
	       ARRAY_SIZE(keywords), usedNodes, ARRAY_SIZE(keywordDict));
#endif
}